

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O1

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|
          (CharClass<wchar_t> *__return_storage_ptr__,CharClass<wchar_t> *this,
          CharClass<wchar_t> *cc)

{
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  wchar_t *pwVar4;
  pointer pRVar5;
  pointer pRVar6;
  Range<wchar_t> rj;
  Range<wchar_t> ri;
  value_type local_50;
  value_type local_40;
  
  CharClass(__return_storage_ptr__);
  pRVar5 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar6 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40._vptr_Range = (_func_int **)&PTR__Range_0019d2a0;
  local_40.m_start = L'\0';
  local_40.m_end = L'\0';
  local_50._vptr_Range = (_func_int **)&PTR__Range_0019d2a0;
  local_50.m_start = L'\0';
  local_50.m_end = L'\0';
  if (pRVar5 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_40.m_start = pRVar5->m_start;
    local_40.m_end = pRVar5->m_end;
  }
  if (pRVar6 != (cc->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_50.m_start = pRVar6->m_start;
    local_50.m_end = pRVar6->m_end;
  }
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar3) {
    do {
      pRVar1 = (cc->m_ranges).
               super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar6 == pRVar1) break;
      pRVar2 = pRVar5;
      if (local_50.m_start < local_40.m_end) {
        if (local_40.m_start < local_50.m_end) {
          if (local_40.m_end < local_50.m_end) {
            if (local_40.m_start < local_50.m_start) {
              local_50.m_start = local_40.m_start;
            }
            pRVar5 = pRVar5 + 1;
            pwVar4 = &local_40.m_start;
            if (pRVar5 != pRVar3) {
LAB_0011f8d9:
              *(undefined8 *)pwVar4 = *(undefined8 *)&pRVar2[1].m_start;
            }
          }
          else {
            if (local_50.m_start < local_40.m_start) {
              local_40.m_start = local_50.m_start;
            }
            pRVar3 = pRVar6 + 1;
            pwVar4 = &local_50.m_start;
            pRVar2 = pRVar6;
            pRVar6 = pRVar3;
            if (pRVar3 != pRVar1) goto LAB_0011f8d9;
          }
        }
        else {
          std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
          push_back(&__return_storage_ptr__->m_ranges,&local_50);
          pRVar3 = pRVar6 + 1;
          pwVar4 = &local_50.m_start;
          pRVar2 = pRVar6;
          pRVar6 = pRVar3;
          if (pRVar3 != (cc->m_ranges).
                        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011f8d9;
        }
      }
      else {
        std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
        push_back(&__return_storage_ptr__->m_ranges,&local_40);
        pRVar5 = pRVar5 + 1;
        pwVar4 = &local_40.m_start;
        if (pRVar5 != (this->m_ranges).
                      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0011f8d9;
      }
      pRVar3 = (this->m_ranges).
               super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (pRVar5 != pRVar3);
  }
  std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<wchar_t>const*,std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>>>
            ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
             &__return_storage_ptr__->m_ranges,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,pRVar5);
  std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<wchar_t>const*,std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>>>
            ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)
             &__return_storage_ptr__->m_ranges,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,pRVar6,
             (cc->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> CharClass<TCHAR>::operator|(const CharClass<TCHAR>& cc) const
{
    CharClass<TCHAR> new_class;

    auto i = m_ranges.cbegin();
    auto j = cc.m_ranges.cbegin();

    Range<TCHAR> ri, rj;

    if (i != m_ranges.cend()) ri = *i;
    if (j != cc.m_ranges.cend()) rj = *j;

    while (i != m_ranges.cend() && j != cc.m_ranges.cend())
    {
        if (ri < rj)
        {
            new_class.m_ranges.push_back(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        else if (ri > rj)
        {
            new_class.m_ranges.push_back(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }
        else
        {
            if (ri.end() < rj.end())
            {
                rj = rj.merge(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else
            {
                ri = ri.merge(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
        }
    }

    new_class.m_ranges.insert(new_class.m_ranges.end(), i, m_ranges.cend());
    new_class.m_ranges.insert(new_class.m_ranges.end(), j, cc.m_ranges.cend());

    return new_class;
}